

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::stop_dht(session_impl *this)

{
  bool bVar1;
  element_type *this_00;
  char *pcVar2;
  session_impl *this_local;
  
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
  pcVar2 = "false";
  if (bVar1) {
    pcVar2 = "true";
  }
  session_log(this,"about to stop DHT, running: %s",pcVar2);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_dht);
    libtorrent::dht::dht_tracker::stop(this_00);
    ::std::__shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_dht).
                super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>);
  }
  ::std::
  unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
  ::reset(&this->m_dht_storage,(pointer)0x0);
  return;
}

Assistant:

void session_impl::stop_dht()
	{
#ifndef TORRENT_DISABLE_LOGGING
		session_log("about to stop DHT, running: %s", m_dht ? "true" : "false");
#endif

		if (m_dht)
		{
			m_dht->stop();
			m_dht.reset();
		}

		m_dht_storage.reset();
	}